

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.h
# Opt level: O0

int MatchSyntaxPattern(KonohaContext *kctx,kNode *node,KTokenSeq *tokens,KTokenSeq *patterns,
                      kToken **errRuleRef)

{
  int iVar1;
  int iVar2;
  kNameSpace *pkVar3;
  KTokenSeq *in_RCX;
  kNode *in_RDX;
  KonohaContext *in_RSI;
  KonohaContext *in_RDI;
  KTokenSeq *in_R8;
  int next;
  KTokenSeq ntokens;
  KTokenSeq nrule_1;
  int nextIdx_1;
  KTokenSeq nrule;
  int nextIdx;
  kSyntax *syn;
  kToken *tk;
  kToken *ruleToken;
  kNameSpace *ns;
  int tokenIdx;
  int patternIdx;
  undefined1 auStackY_e0 [24];
  kNameSpace *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  int local_b4;
  undefined1 auStackY_b0 [28];
  int local_94;
  kNameSpace *in_stack_ffffffffffffff70;
  kArray *in_stack_ffffffffffffff78;
  ksymbol_t in_stack_ffffffffffffff84;
  kNode *in_stack_ffffffffffffff88;
  kSyntax *in_stack_ffffffffffffff90;
  KonohaContext *in_stack_ffffffffffffff98;
  kArray *pkVar4;
  kNameSpace *pkVar5;
  int iVar6;
  
  iVar2 = in_RCX->beginIdx;
  iVar1 = *(int *)&(in_RDX->h).prototypePtr;
  pkVar3 = kNode_GetNameSpace(in_RDI,(kNode *)in_RSI);
  do {
    if (in_RCX->endIdx <= iVar2) {
      return iVar1;
    }
    pkVar5 = (kNameSpace *)(in_RCX->tokenList->field_2).unboxItems[iVar2];
    iVar6 = iVar1;
    do {
      if (*(int *)((long)&(in_RDX->h).prototypePtr + 4) <= iVar6) {
        while( true ) {
          if (in_RCX->endIdx <= iVar2 + 1) {
            return iVar6;
          }
          if ((*(int *)&pkVar5->importedNameSpaceList != 0x60000008) &&
             (((pkVar5->h).magicflag & 0x100) != 0x100)) break;
          iVar2 = iVar2 + 1;
          pkVar5 = (kNameSpace *)(in_RCX->tokenList->field_2).unboxItems[iVar2];
        }
        in_R8->ns = pkVar5;
        in_R8->tokenList = (kArray *)0x0;
        return -1;
      }
      pkVar4 = *(kArray **)(((in_RDX->h).ct)->unbox + (long)iVar6 * 8);
      in_R8->tokenList = pkVar4;
      if (((ulong)pkVar5->importedNameSpaceList & 0xe0000000) == 0xe0000000) {
        (*in_RDI->klib->kNameSpace_GetSyntax)
                  (in_RDI,pkVar3,*(ksymbol_t *)&pkVar5->importedNameSpaceList);
        iVar1 = ParseSyntaxNode(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                in_stack_ffffffffffffff78,
                                (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)pkVar4,
                                (int)pkVar5);
        if (iVar1 == -1) {
          iVar1 = iVar6;
          if (((pkVar5->h).magicflag & 0x100) != 0x100) {
            in_R8->ns = pkVar5;
            return -1;
          }
          break;
        }
      }
      else if (*(int *)&pkVar5->importedNameSpaceList == 0x60000008) {
        in_stack_ffffffffffffff78 = *(kArray **)&pkVar5->packageId;
        in_stack_ffffffffffffff84 = (int)(*(ulong *)(*(long *)&pkVar5->packageId + 0x18) >> 3) - 1;
        memset(&stack0xffffffffffffff88,0,0x18);
        *(int *)&(in_RDX->h).prototypePtr = iVar6;
        local_94 = MatchSyntaxPattern(in_RSI,in_RDX,in_RCX,in_R8,(kToken **)CONCAT44(iVar2,iVar6));
        in_R8->ns = (kNameSpace *)0x0;
        if (*(int *)&in_RSI->klib == 0x18) {
          return *(int *)((long)&(in_RDX->h).prototypePtr + 4);
        }
        in_stack_ffffffffffffff70 = pkVar3;
        iVar1 = iVar6;
        if (local_94 != -1) {
          iVar1 = local_94;
        }
      }
      else {
        if (*(int *)&pkVar5->importedNameSpaceList != (int)pkVar4[1].h.magicflag) {
          in_R8->ns = pkVar5;
          return -1;
        }
        if ((*(int *)&pkVar5->NameSpaceConstList == 7) || (*(int *)&pkVar5->NameSpaceConstList == 8)
           ) {
          local_c0._0_4_ = pkVar5->packageId;
          local_c0._4_4_ = pkVar5->syntaxOption;
          local_b8 = 1;
          local_b4 = (int)(*(ulong *)(*(long *)&pkVar5->packageId + 0x18) >> 3) + -1;
          local_c8 = pkVar3;
          memset(auStackY_b0,0,0x18);
          memset(auStackY_e0,0,0x18);
          iVar1 = MatchSyntaxPattern(in_RSI,in_RDX,in_RCX,in_R8,(kToken **)CONCAT44(iVar2,iVar6));
          if (iVar1 == -1) {
            return -1;
          }
        }
        iVar1 = iVar6 + 1;
      }
      iVar6 = iVar1;
    } while (((pkVar5->h).magicflag & 0x100) == 0x100);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static int MatchSyntaxPattern(KonohaContext *kctx, kNode *node, KTokenSeq *tokens, KTokenSeq *patterns, kToken **errRuleRef)
{
	int patternIdx = patterns->beginIdx, tokenIdx = tokens->beginIdx;
	kNameSpace *ns = kNode_ns(node);
	//KLIB dumpTokenArray(kctx, 0, patterns->tokenList, patterns->beginIdx, patterns->endIdx);
	//KLIB dumpTokenArray(kctx, 0, tokens->tokenList, tokens->beginIdx, tokens->endIdx);
	for(; patternIdx < patterns->endIdx; patternIdx++) {
		kToken *ruleToken = patterns->tokenList->TokenItems[patternIdx];
		L_ReDo:;
		//tokenIdx = TokenUtils_SkipOnlyIndent(tokens->tokenList, tokenIdx, tokens->endIdx);
		//DBG_P("patternIdx=%d, tokenIdx=%d, tokenEndIdx=%d", patternIdx, tokenIdx, tokens->endIdx);
		//KDump(node);
		if(tokenIdx < tokens->endIdx) {
			kToken *tk = tokens->tokenList->TokenItems[tokenIdx];
			errRuleRef[1] = tk;
			if(KSymbol_IsPattern(ruleToken->symbol)) {
				kSyntax *syn = kSyntax_(ns, ruleToken->symbol);
				int nextIdx = ParseSyntaxNode(kctx, syn, node, ruleToken->ruleNameSymbol, tokens->tokenList, tokenIdx, -1, tokens->endIdx);
				if(nextIdx == PatternNoMatch) {
					if(!kToken_Is(MatchPreviousPattern, ruleToken)) {
						errRuleRef[0] = ruleToken;
						return PatternNoMatch;
					}
					continue;  /* to avoid check same rule */
				}
				tokenIdx = nextIdx ;
			}
			else if(ruleToken->symbol == KSymbol_OptionalGroup) {
				KTokenSeq nrule = {ns, RangeGroup(ruleToken->GroupTokenList)};
				tokens->beginIdx = tokenIdx;
				int nextIdx = MatchSyntaxPattern(kctx, node, tokens, &nrule, errRuleRef);
				errRuleRef[0] = NULL;
				if(kNode_IsError(node)) return tokens->endIdx;
				if(nextIdx != PatternNoMatch) {
					tokenIdx = nextIdx;
				}
			}
			else {
				if(ruleToken->symbol != tk->symbol) {
					errRuleRef[0] = ruleToken;
					return PatternNoMatch;
				}
				if(ruleToken->tokenType == KSymbol_ParenthesisGroup || ruleToken->tokenType == KSymbol_BracketGroup) {
					KTokenSeq nrule = {ns, RangeGroup(ruleToken->GroupTokenList)};
					KTokenSeq ntokens = {ns, RangeGroup(tk->GroupTokenList)};
					int next = MatchSyntaxPattern(kctx, node, &ntokens, &nrule, errRuleRef);
					if(next == PatternNoMatch) {
						return PatternNoMatch;
					}
				}
				tokenIdx++;
			}
			if(kToken_Is(MatchPreviousPattern, ruleToken)) {
				goto L_ReDo;
			}
		}
		else { /* tokenIdx < patterns->endIdx */
			while(patternIdx + 1 < patterns->endIdx) {
				if(ruleToken->symbol != KSymbol_OptionalGroup && !kToken_Is(MatchPreviousPattern,ruleToken)) {
					errRuleRef[0] = ruleToken;
					errRuleRef[1] = NULL;
					return -1;
				}
				patternIdx++;
				ruleToken = patterns->tokenList->TokenItems[patternIdx];
			}
			return tokenIdx;
		}
	}
	return tokenIdx;
}